

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O1

int spng_set_chrm(spng_ctx *ctx,spng_chrm *chrm)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  iVar1 = 1;
  if ((chrm != (spng_chrm *)0x0 && ctx != (spng_ctx *)0x0) &&
     (((ctx->data != (uchar *)0x0 || (iVar1 = 0x52, (ctx->field_0xcc & 0x10) != 0)) &&
      (iVar1 = read_chunks(ctx,0), iVar1 == 0)))) {
    uVar2 = (uint)(long)(chrm->white_point_x * 100000.0);
    uVar3 = (uint)(long)(chrm->white_point_y * 100000.0);
    uVar4 = (uint)(long)(chrm->red_x * 100000.0);
    uVar5 = (uint)(long)(chrm->red_y * 100000.0);
    uVar6 = (uint)(long)(chrm->green_x * 100000.0);
    uVar7 = (uint)(long)(chrm->green_y * 100000.0);
    uVar8 = (uint)(long)(chrm->blue_x * 100000.0);
    iVar1 = 0x22;
    uVar9 = (uint)(long)(chrm->blue_y * 100000.0);
    if (-1 < (int)(uVar6 | uVar7 | uVar8 | uVar4 | uVar5 | uVar2 | uVar3 | uVar9)) {
      (ctx->chrm_int).white_point_x = uVar2;
      (ctx->chrm_int).white_point_y = uVar3;
      (ctx->chrm_int).red_x = uVar4;
      (ctx->chrm_int).red_y = uVar5;
      (ctx->chrm_int).green_x = uVar6;
      (ctx->chrm_int).green_y = uVar7;
      (ctx->chrm_int).blue_x = uVar8;
      (ctx->chrm_int).blue_y = uVar9;
      *(byte *)&ctx->stored = *(byte *)&ctx->stored | 4;
      *(byte *)&ctx->user = *(byte *)&ctx->user | 4;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int spng_set_chrm(spng_ctx *ctx, struct spng_chrm *chrm)
{
    SPNG_SET_CHUNK_BOILERPLATE(chrm);

    struct spng_chrm_int chrm_int;

    chrm_int.white_point_x = (uint32_t)(chrm->white_point_x * 100000.0);
    chrm_int.white_point_y = (uint32_t)(chrm->white_point_y * 100000.0);
    chrm_int.red_x = (uint32_t)(chrm->red_x * 100000.0);
    chrm_int.red_y = (uint32_t)(chrm->red_y * 100000.0);
    chrm_int.green_x = (uint32_t)(chrm->green_x * 100000.0);
    chrm_int.green_y = (uint32_t)(chrm->green_y * 100000.0);
    chrm_int.blue_x = (uint32_t)(chrm->blue_x * 100000.0);
    chrm_int.blue_y = (uint32_t)(chrm->blue_y * 100000.0);

    if(check_chrm_int(&chrm_int)) return SPNG_ECHRM;

    ctx->chrm_int = chrm_int;

    ctx->stored.chrm = 1;
    ctx->user.chrm = 1;

    return 0;
}